

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  char cVar1;
  archive_entry *paVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  char *pcVar7;
  byte *name;
  long lVar8;
  byte *pbVar9;
  size_t sVar10;
  dev_t dVar11;
  size_t sVar12;
  int64_t iVar13;
  archive_string_conv *sc;
  archive_string *paVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  byte bVar19;
  uint uVar20;
  archive_entry *paVar21;
  archive_string *paVar22;
  archive_entry *entry_00;
  uint uVar23;
  archive_string *paVar24;
  archive_string *paVar25;
  char *pcVar26;
  ulong uVar27;
  char *pcVar28;
  byte *pbVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined8 uVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int64_t s;
  long local_98;
  time_t local_90;
  archive_string *local_88;
  archive_string *local_80;
  archive_string *local_78;
  int64_t *local_70;
  archive_string *local_68;
  wchar_t local_5c;
  ulong local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  wVar3 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar3 != L'\0') {
    return wVar3;
  }
  wVar3 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar3 != L'\0') && (wVar3 != L'\xffffffec')) {
    return wVar3;
  }
  pcVar26 = (tar->pax_header).s;
  uVar16 = (tar->pax_header).length;
  tar->pax_hdrcharset_binary = 0;
  paVar14 = &tar->entry_gname;
  wVar6 = L'\0';
  (tar->entry_gname).length = 0;
  local_68 = &tar->entry_linkpath;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  paVar22 = &tar->entry_pathname_override;
  paVar24 = &tar->entry_pathname;
  paVar25 = &tar->entry_uname;
  if (uVar16 != 0) {
    local_70 = &tar->sparse_offset;
    uVar32 = 0x494843524142494c;
    uVar35 = 0x72747461782e4556;
    wVar6 = L'\0';
LAB_00157ec0:
    local_5c = wVar6;
    paVar21 = (archive_entry *)(pcVar26 + uVar16);
    pcVar7 = pcVar26 + (uVar16 - 1);
    uVar27 = 0;
    uVar15 = uVar16;
    pcVar28 = pcVar26;
    do {
      cVar1 = *pcVar28;
      local_58 = uVar16;
      if (cVar1 == ' ') {
        paVar21 = (archive_entry *)(pcVar28 + 1);
        pcVar7 = pcVar28;
        break;
      }
      if ((byte)(cVar1 - 0x3aU) < 0xf6) {
        pcVar26 = "Ignoring malformed pax extended attributes";
        goto LAB_00158cbf;
      }
      uVar27 = (ulong)(byte)(cVar1 - 0x30) + uVar27 * 10;
      if (999999 < uVar27) {
        pcVar26 = "Rejecting pax extended attribute > 1MB";
        goto LAB_00158cbf;
      }
      pcVar28 = pcVar28 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    uVar15 = uVar27 - 1;
    if ((uVar16 <= uVar15) || (pcVar26[uVar15] != '\n')) {
      pcVar26 = "Ignoring malformed pax extended attribute";
LAB_00158cbf:
      archive_set_error(&a->archive,-1,pcVar26);
      wVar5 = L'\xffffffec';
      goto LAB_00158cd1;
    }
    pcVar26[uVar15] = '\0';
    cVar1 = *(char *)&paVar21->archive;
    if (cVar1 == '=') {
      wVar5 = L'\xffffffff';
      goto LAB_00158cd1;
    }
    local_50 = pcVar26 + uVar27;
    pcVar26 = local_50 + (-2 - (long)paVar21);
    paVar2 = paVar21;
    while( true ) {
      entry_00 = (archive_entry *)((long)&paVar2->archive + 1);
      if (cVar1 == '\0') {
        pcVar26 = "Invalid pax extended attributes";
        goto LAB_00158cbf;
      }
      if (cVar1 == '=') break;
      cVar1 = *(char *)&entry_00->archive;
      pcVar26 = pcVar26 + -1;
      paVar2 = entry_00;
    }
    *(char *)&paVar2->archive = '\0';
    bVar19 = *(byte *)&paVar21->archive;
    local_88 = paVar22;
    local_80 = paVar25;
    local_78 = paVar24;
    local_48 = uVar32;
    uStack_40 = uVar35;
    if (bVar19 < 0x53) {
      if (bVar19 != 0x47) {
        if (bVar19 != 0x4c) {
          if ((bVar19 == 0x52) &&
             (iVar4 = strcmp((char *)paVar21,"RHT.security.selinux"), iVar4 == 0)) {
            archive_entry_xattr_add_entry(entry,"security.selinux",entry_00,(size_t)pcVar26);
          }
          goto switchD_00157fc0_caseD_1;
        }
        iVar4 = strcmp((char *)paVar21,"LIBARCHIVE.creationtime");
        if (iVar4 == 0) {
          pax_time((char *)entry_00,&local_90,&local_98);
          archive_entry_set_birthtime(entry,local_90,local_98);
        }
        iVar4 = strcmp((char *)paVar21,"LIBARCHIVE.symlinktype");
        if (iVar4 == 0) {
          iVar4 = strcmp((char *)entry_00,"file");
          if (iVar4 == 0) {
            wVar6 = L'\x01';
          }
          else {
            iVar4 = strcmp((char *)entry_00,"dir");
            if (iVar4 != 0) goto LAB_001587f6;
            wVar6 = L'\x02';
          }
          archive_entry_set_symlink_type(entry,wVar6);
        }
LAB_001587f6:
        auVar30[0] = -(*(char *)&paVar21->archive == 'L');
        auVar30[1] = -(*(char *)((long)&paVar21->archive + 1) == 'I');
        auVar30[2] = -(*(char *)((long)&paVar21->archive + 2) == 'B');
        auVar30[3] = -(*(char *)((long)&paVar21->archive + 3) == 'A');
        auVar30[4] = -(*(char *)((long)&paVar21->archive + 4) == 'R');
        auVar30[5] = -(*(char *)((long)&paVar21->archive + 5) == 'C');
        auVar30[6] = -(*(char *)((long)&paVar21->archive + 6) == 'H');
        auVar30[7] = -(*(char *)((long)&paVar21->archive + 7) == 'I');
        auVar30[8] = -(*(char *)&paVar21->stat == 'V');
        auVar30[9] = -(*(char *)((long)&paVar21->stat + 1) == 'E');
        auVar30[10] = -(*(char *)((long)&paVar21->stat + 2) == '.');
        auVar30[0xb] = -(*(char *)((long)&paVar21->stat + 3) == 'x');
        auVar30[0xc] = -(*(char *)((long)&paVar21->stat + 4) == 'a');
        auVar30[0xd] = -(*(char *)((long)&paVar21->stat + 5) == 't');
        auVar30[0xe] = -(*(char *)((long)&paVar21->stat + 6) == 't');
        auVar30[0xf] = -(*(char *)((long)&paVar21->stat + 7) == 'r');
        auVar33[0] = -((char)paVar21->stat_valid == '.');
        auVar33[1] = 0xff;
        auVar33[2] = 0xff;
        auVar33[3] = 0xff;
        auVar33[4] = 0xff;
        auVar33[5] = 0xff;
        auVar33[6] = 0xff;
        auVar33[7] = 0xff;
        auVar33[8] = 0xff;
        auVar33[9] = 0xff;
        auVar33[10] = 0xff;
        auVar33[0xb] = 0xff;
        auVar33[0xc] = 0xff;
        auVar33[0xd] = 0xff;
        auVar33[0xe] = 0xff;
        auVar33[0xf] = 0xff;
        auVar33 = auVar33 & auVar30;
        if (((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) &&
           (sVar12 = strlen((char *)paVar21), 0x11 < sVar12)) {
          auVar31[0] = -(*(char *)&paVar21->archive == (char)local_48);
          auVar31[1] = -(*(char *)((long)&paVar21->archive + 1) == local_48._1_1_);
          auVar31[2] = -(*(char *)((long)&paVar21->archive + 2) == local_48._2_1_);
          auVar31[3] = -(*(char *)((long)&paVar21->archive + 3) == local_48._3_1_);
          auVar31[4] = -(*(char *)((long)&paVar21->archive + 4) == local_48._4_1_);
          auVar31[5] = -(*(char *)((long)&paVar21->archive + 5) == local_48._5_1_);
          auVar31[6] = -(*(char *)((long)&paVar21->archive + 6) == local_48._6_1_);
          auVar31[7] = -(*(char *)((long)&paVar21->archive + 7) == local_48._7_1_);
          auVar31[8] = -(*(char *)&paVar21->stat == (char)uStack_40);
          auVar31[9] = -(*(char *)((long)&paVar21->stat + 1) == uStack_40._1_1_);
          auVar31[10] = -(*(char *)((long)&paVar21->stat + 2) == uStack_40._2_1_);
          auVar31[0xb] = -(*(char *)((long)&paVar21->stat + 3) == uStack_40._3_1_);
          auVar31[0xc] = -(*(char *)((long)&paVar21->stat + 4) == uStack_40._4_1_);
          auVar31[0xd] = -(*(char *)((long)&paVar21->stat + 5) == uStack_40._5_1_);
          auVar31[0xe] = -(*(char *)((long)&paVar21->stat + 6) == uStack_40._6_1_);
          auVar31[0xf] = -(*(char *)((long)&paVar21->stat + 7) == uStack_40._7_1_);
          auVar34[0] = -((char)paVar21->stat_valid == '.');
          auVar34[1] = 0xff;
          auVar34[2] = 0xff;
          auVar34[3] = 0xff;
          auVar34[4] = 0xff;
          auVar34[5] = 0xff;
          auVar34[6] = 0xff;
          auVar34[7] = 0xff;
          auVar34[8] = 0xff;
          auVar34[9] = 0xff;
          auVar34[10] = 0xff;
          auVar34[0xb] = 0xff;
          auVar34[0xc] = 0xff;
          auVar34[0xd] = 0xff;
          auVar34[0xe] = 0xff;
          auVar34[0xf] = 0xff;
          auVar34 = auVar34 & auVar31;
          if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff) {
            pbVar29 = (byte *)(pcVar7 + 0x12);
            sVar12 = strlen((char *)pbVar29);
            name = (byte *)malloc(sVar12 + 1);
            pbVar9 = name;
            if (name != (byte *)0x0) {
              do {
                bVar19 = *pbVar29;
                if (bVar19 == 0x25) {
                  iVar4 = (int)(char)pbVar29[1];
                  if ((pbVar29[1] == 0) || (iVar17 = (int)(char)pbVar29[2], pbVar29[2] == 0))
                  goto LAB_0015891d;
                  uVar20 = iVar4 - 0x30;
                  if (9 < uVar20) {
                    if (iVar4 - 0x41U < 6) {
                      uVar20 = iVar4 - 0x37;
                    }
                    else {
                      uVar20 = iVar4 - 0x57;
                      if (5 < iVar4 - 0x61U) {
                        uVar20 = 0xffffffff;
                      }
                    }
                  }
                  uVar18 = iVar17 - 0x30;
                  if (9 < uVar18) {
                    if (iVar17 - 0x41U < 6) {
                      uVar18 = iVar17 - 0x37;
                    }
                    else {
                      uVar18 = iVar17 - 0x57;
                      if (5 < iVar17 - 0x61U) {
                        uVar18 = 0xffffffff;
                      }
                    }
                  }
                  if (((int)uVar20 < 0) || ((int)uVar18 < 0)) goto LAB_0015891d;
                  pbVar29 = pbVar29 + 3;
                  bVar19 = (byte)uVar18 | (byte)(uVar20 << 4);
                }
                else {
                  if (bVar19 == 0) goto LAB_001589b1;
LAB_0015891d:
                  pbVar29 = pbVar29 + 1;
                }
                *pbVar9 = bVar19;
                pbVar9 = pbVar9 + 1;
              } while( true );
            }
          }
        }
        goto LAB_0015894e;
      }
      iVar4 = strncmp((char *)paVar21,"GNU.sparse",10);
      if ((iVar4 == 0) && (tar->sparse_allowed == 0)) {
        archive_set_error(&a->archive,-1,"Non-regular file cannot be sparse");
        goto LAB_00158f2a;
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.numblocks");
      if (iVar4 == 0) {
        *(undefined4 *)local_70 = 0xffffffff;
        *(undefined4 *)((long)local_70 + 4) = 0xffffffff;
        *(undefined4 *)(local_70 + 1) = 0xffffffff;
        *(undefined4 *)((long)local_70 + 0xc) = 0xffffffff;
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 0;
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.offset");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_offset = iVar13;
        if (tar->sparse_numbytes != -1) {
          wVar6 = gnu_add_sparse_entry(a,tar,iVar13,tar->sparse_numbytes);
          if (wVar6 != L'\0') goto LAB_00158f2a;
          *(undefined4 *)local_70 = 0xffffffff;
          *(undefined4 *)((long)local_70 + 4) = 0xffffffff;
          *(undefined4 *)(local_70 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_70 + 0xc) = 0xffffffff;
        }
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.numbytes");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_numbytes = iVar13;
        if (tar->sparse_offset != -1) {
          wVar6 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar13);
          if (wVar6 != L'\0') goto LAB_00158f2a;
          *(undefined4 *)local_70 = 0xffffffff;
          *(undefined4 *)((long)local_70 + 4) = 0xffffffff;
          *(undefined4 *)(local_70 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_70 + 0xc) = 0xffffffff;
        }
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.size");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->realsize = iVar13;
        archive_entry_set_size(entry,iVar13);
        tar->realsize_override = 1;
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.map");
      if (iVar4 == 0) {
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 1;
        wVar5 = gnu_sparse_01_parse(a,tar,(char *)entry_00);
        wVar6 = L'\xffffffec';
        if (wVar5 != L'\0') goto LAB_00158bbf;
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.major");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_gnu_major = (int)iVar13;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.minor");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_gnu_minor = (int)iVar13;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.name");
      if (iVar4 == 0) {
        (tar->entry_pathname_override).length = 0;
        sVar12 = strlen((char *)entry_00);
        archive_strncat(local_88,entry_00,sVar12);
      }
      iVar4 = strcmp((char *)paVar21,"GNU.sparse.realsize");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->realsize = iVar13;
        archive_entry_set_size(entry,iVar13);
        tar->realsize_override = 1;
      }
      goto LAB_0015894e;
    }
    pcVar7 = (char *)(ulong)(bVar19 - 0x61);
    switch(pcVar7) {
    case (char *)0x0:
      iVar4 = strcmp((char *)paVar21,"atime");
      if (iVar4 == 0) {
        pax_time((char *)entry_00,&local_90,&local_98);
        archive_entry_set_atime(entry,local_90,local_98);
      }
      break;
    case (char *)0x1:
    case (char *)0x3:
    case (char *)0x4:
    case (char *)0x5:
    case (char *)0x8:
    case (char *)0x9:
    case (char *)0xa:
    case (char *)0xd:
    case (char *)0xe:
    case (char *)0x10:
    case (char *)0x11:
    case (char *)0x13:
      goto switchD_00157fc0_caseD_1;
    case (char *)0x2:
      iVar4 = strcmp((char *)paVar21,"ctime");
      if (iVar4 == 0) {
        pax_time((char *)entry_00,&local_90,&local_98);
        archive_entry_set_ctime(entry,local_90,local_98);
      }
      break;
    case (char *)0x6:
      iVar4 = strcmp((char *)paVar21,"gid");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        archive_entry_set_gid(entry,iVar13);
      }
      else {
        iVar4 = strcmp((char *)paVar21,"gname");
        if (iVar4 == 0) {
          (tar->entry_gname).length = 0;
          sVar10 = strlen((char *)entry_00);
          paVar22 = paVar14;
          goto LAB_001586e9;
        }
      }
      break;
    case (char *)0x7:
      iVar4 = strcmp((char *)paVar21,"hdrcharset");
      if (iVar4 == 0) {
        iVar4 = strcmp((char *)entry_00,"BINARY");
        if (iVar4 == 0) {
          tar->pax_hdrcharset_binary = 1;
        }
        else {
          iVar4 = strcmp((char *)entry_00,"ISO-IR 10646 2000 UTF-8");
          if (iVar4 == 0) {
            tar->pax_hdrcharset_binary = 0;
          }
        }
      }
      break;
    case (char *)0xb:
      iVar4 = strcmp((char *)paVar21,"linkpath");
      if (iVar4 == 0) {
        (tar->entry_linkpath).length = 0;
        sVar10 = strlen((char *)entry_00);
        paVar22 = local_68;
LAB_001586e9:
        archive_strncat(paVar22,entry_00,sVar10);
      }
      break;
    case (char *)0xc:
      iVar4 = strcmp((char *)paVar21,"mtime");
      if (iVar4 == 0) {
        pax_time((char *)entry_00,&local_90,&local_98);
        archive_entry_set_mtime(entry,local_90,local_98);
      }
      break;
    case (char *)0xf:
      iVar4 = strcmp((char *)paVar21,"path");
      if (iVar4 == 0) {
        (tar->entry_pathname).length = 0;
        sVar10 = strlen((char *)entry_00);
        paVar22 = local_78;
        goto LAB_001586e9;
      }
      break;
    case (char *)0x12:
      iVar4 = strcmp((char *)paVar21,"size");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->entry_bytes_remaining = iVar13;
        if (tar->realsize_override == 0) {
          archive_entry_set_size(entry,iVar13);
          tar->realsize = tar->entry_bytes_remaining;
        }
      }
      break;
    case (char *)0x14:
      iVar4 = strcmp((char *)paVar21,"uid");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        archive_entry_set_uid(entry,iVar13);
      }
      else {
        iVar4 = strcmp((char *)paVar21,"uname");
        if (iVar4 == 0) {
          (tar->entry_uname).length = 0;
          sVar10 = strlen((char *)entry_00);
          paVar22 = local_80;
          goto LAB_001586e9;
        }
      }
      break;
    default:
      if (bVar19 != 0x53) goto switchD_00157fc0_caseD_1;
      iVar4 = strcmp((char *)paVar21,"SCHILY.acl.access");
      if (iVar4 == 0) {
        wVar6 = L'Ā';
LAB_0015896e:
        wVar5 = pax_attribute_acl(a,tar,entry,(char *)entry_00,wVar6);
        wVar6 = L'\0';
        if (wVar5 != L'\xffffffe2') goto LAB_00158bbf;
        goto LAB_00158f2a;
      }
      iVar4 = strcmp((char *)paVar21,"SCHILY.acl.default");
      if (iVar4 == 0) {
        wVar6 = L'Ȁ';
        goto LAB_0015896e;
      }
      iVar4 = strcmp((char *)paVar21,"SCHILY.acl.ace");
      if (iVar4 == 0) {
        wVar6 = L'㰀';
        goto LAB_0015896e;
      }
      iVar4 = strcmp((char *)paVar21,"SCHILY.devmajor");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        dVar11 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        archive_entry_set_rdevmajor(entry,dVar11);
      }
      else {
        iVar4 = strcmp((char *)paVar21,"SCHILY.devminor");
        if (iVar4 == 0) {
          sVar12 = strlen((char *)entry_00);
          dVar11 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
          archive_entry_set_rdevminor(entry,dVar11);
        }
        else {
          iVar4 = strcmp((char *)paVar21,"SCHILY.fflags");
          if (iVar4 == 0) {
            archive_entry_copy_fflags_text(entry,(char *)entry_00);
          }
          else {
            iVar4 = strcmp((char *)paVar21,"SCHILY.dev");
            if (iVar4 == 0) {
              sVar12 = strlen((char *)entry_00);
              dVar11 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
              archive_entry_set_dev(entry,dVar11);
            }
            else {
              iVar4 = strcmp((char *)paVar21,"SCHILY.ino");
              if (iVar4 == 0) {
                sVar12 = strlen((char *)entry_00);
                iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
                archive_entry_set_ino(entry,iVar13);
              }
              else {
                iVar4 = strcmp((char *)paVar21,"SCHILY.nlink");
                if (iVar4 == 0) {
                  sVar12 = strlen((char *)entry_00);
                  iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
                  archive_entry_set_nlink(entry,(uint)iVar13);
                }
                else {
                  iVar4 = strcmp((char *)paVar21,"SCHILY.realsize");
                  if (iVar4 == 0) {
                    sVar12 = strlen((char *)entry_00);
                    iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
                    tar->realsize = iVar13;
                    tar->realsize_override = 1;
                    archive_entry_set_size(entry,iVar13);
                  }
                  else {
                    iVar4 = strncmp((char *)paVar21,"SCHILY.xattr.",0xd);
                    if (iVar4 != 0) {
                      iVar4 = strcmp((char *)paVar21,"SUN.holesdata");
                      if (iVar4 != 0) goto switchD_00157fc0_caseD_1;
                      wVar5 = solaris_sparse_parse(a,tar,entry_00,pcVar7);
                      wVar6 = L'\0';
                      if (wVar5 < L'\0') {
                        if (wVar5 != L'\xffffffe2') {
                          archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
                          wVar6 = wVar5;
                          goto LAB_00158bbf;
                        }
                        goto LAB_00158f2a;
                      }
                      goto LAB_00158bbf;
                    }
                    pax_attribute_schily_xattr
                              (entry,(char *)paVar21,(char *)entry_00,(size_t)pcVar26);
                  }
                }
              }
            }
          }
        }
      }
      goto switchD_00157fc0_caseD_1;
    }
LAB_0015894e:
    wVar6 = L'\0';
    goto LAB_00158bbf;
  }
LAB_00158d2e:
  local_88 = paVar22;
  local_80 = paVar25;
  local_78 = paVar24;
  sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
  if (sc == (archive_string_conv *)0x0) {
LAB_00158f2a:
    wVar5 = L'\xffffffe2';
    goto LAB_00158cd1;
  }
  if (tar->compat_2x != 0) {
    archive_string_conversion_set_opt(sc,L'\x01');
  }
LAB_00158d7d:
  sVar10 = (tar->entry_gname).length;
  if ((sVar10 != 0) &&
     (wVar5 = _archive_entry_copy_gname_l(entry,paVar14->s,sVar10,sc), wVar5 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Gname");
    wVar5 = L'\xffffffe2';
    if (wVar6 == L'\xffffffe2') goto LAB_00158cd1;
    archive_entry_copy_gname(entry,paVar14->s);
  }
  sVar10 = (tar->entry_linkpath).length;
  if ((sVar10 != 0) &&
     (wVar5 = _archive_entry_copy_link_l(entry,local_68->s,sVar10,sc), wVar5 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Linkname");
    wVar5 = L'\xffffffe2';
    if (wVar6 == L'\xffffffe2') goto LAB_00158cd1;
    archive_entry_copy_link(entry,local_68->s);
  }
  paVar14 = local_88;
  if ((((tar->entry_pathname_override).length != 0) ||
      (paVar14 = local_78, (tar->entry_pathname).length != 0)) &&
     (local_88 = paVar14,
     wVar5 = _archive_entry_copy_pathname_l(entry,paVar14->s,paVar14->length,sc), wVar5 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Pathname");
    wVar5 = L'\xffffffe2';
    if (wVar6 == L'\xffffffe2') goto LAB_00158cd1;
    archive_entry_copy_pathname(entry,local_88->s);
  }
  sVar10 = (tar->entry_uname).length;
  wVar5 = wVar6;
  if ((sVar10 != 0) &&
     (wVar6 = _archive_entry_copy_uname_l(entry,local_80->s,sVar10,sc), wVar6 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Uname");
    wVar5 = L'\xffffffe2';
    if (wVar6 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_80->s);
      wVar5 = wVar6;
    }
  }
LAB_00158cd1:
  if (wVar3 < wVar5) {
    wVar5 = wVar3;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar5;
LAB_001589b1:
  *pbVar9 = 0;
  sVar12 = strlen((char *)entry_00);
  if (base64_decode_decode_table[0x42] != '\x01') {
    base64_decode_decode_table._112_4_ = 0xffffffff;
    base64_decode_decode_table._116_4_ = 0xffffffff;
    base64_decode_decode_table._120_4_ = 0xffffffff;
    base64_decode_decode_table._124_4_ = 0xffffffff;
    base64_decode_decode_table._96_4_ = 0xffffffff;
    base64_decode_decode_table._100_4_ = 0xffffffff;
    base64_decode_decode_table._104_4_ = 0xffffffff;
    base64_decode_decode_table._108_4_ = 0xffffffff;
    base64_decode_decode_table._80_4_ = 0xffffffff;
    base64_decode_decode_table._84_4_ = 0xffffffff;
    base64_decode_decode_table._88_4_ = 0xffffffff;
    base64_decode_decode_table._92_4_ = 0xffffffff;
    base64_decode_decode_table._64_4_ = 0xffffffff;
    base64_decode_decode_table._68_4_ = 0xffffffff;
    base64_decode_decode_table._72_4_ = 0xffffffff;
    base64_decode_decode_table._76_4_ = 0xffffffff;
    base64_decode_decode_table._48_4_ = 0xffffffff;
    base64_decode_decode_table._52_4_ = 0xffffffff;
    base64_decode_decode_table._56_4_ = 0xffffffff;
    base64_decode_decode_table._60_4_ = 0xffffffff;
    base64_decode_decode_table._32_4_ = 0xffffffff;
    base64_decode_decode_table._36_4_ = 0xffffffff;
    base64_decode_decode_table._40_4_ = 0xffffffff;
    base64_decode_decode_table._44_4_ = 0xffffffff;
    base64_decode_decode_table._16_4_ = 0xffffffff;
    base64_decode_decode_table._20_4_ = 0xffffffff;
    base64_decode_decode_table._24_4_ = 0xffffffff;
    base64_decode_decode_table._28_4_ = 0xffffffff;
    base64_decode_decode_table._0_4_ = 0xffffffff;
    base64_decode_decode_table._4_4_ = 0xffffffff;
    base64_decode_decode_table._8_4_ = 0xffffffff;
    base64_decode_decode_table._12_4_ = 0xffffffff;
    lVar8 = 0;
    do {
      base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar8]] = (char)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x40);
  }
  pbVar9 = (byte *)malloc((sVar12 - (sVar12 >> 2)) + 1);
  if (pbVar9 != (byte *)0x0) {
    pbVar29 = pbVar9;
    if (sVar12 == 0) {
      sVar10 = 0;
    }
    else {
      do {
        uVar18 = 0;
        uVar20 = 0;
        do {
          lVar8 = 1 - sVar12;
          paVar21 = entry_00;
LAB_00158a73:
          bVar19 = *(byte *)&paVar21->archive;
          if ((bVar19 == 0x3d) || (bVar19 == 0x5f)) goto LAB_00158ad9;
          if (((char)bVar19 < ' ') || ((byte)base64_decode_decode_table[bVar19] == 0xff))
          goto LAB_00158a98;
          uVar18 = uVar18 << 6 | (uint)(byte)base64_decode_decode_table[bVar19];
          uVar23 = uVar20 + 1;
          if (2 < uVar20) break;
          entry_00 = (archive_entry *)((long)&paVar21->archive + 1);
          sVar12 = -lVar8;
          uVar20 = uVar23;
        } while (lVar8 != 0);
        paVar21 = (archive_entry *)((long)&paVar21->archive + 1);
        sVar12 = -lVar8;
LAB_00158adc:
        iVar4 = uVar18 << (('\x04' - (char)uVar23) * '\x06' & 0x1fU);
        if (uVar23 == 2) {
LAB_00158b00:
          *pbVar29 = (byte)((uint)iVar4 >> 0x10);
        }
        else {
          if (uVar23 == 3) {
LAB_00158afd:
            pbVar29[1] = (byte)((uint)iVar4 >> 8);
            goto LAB_00158b00;
          }
          if (uVar23 == 4) {
            pbVar29[2] = (byte)iVar4;
            goto LAB_00158afd;
          }
        }
        iVar4 = uVar23 * 3 + 3;
        if (-1 < (int)(uVar23 * 3)) {
          iVar4 = uVar23 * 3;
        }
        pbVar29 = pbVar29 + (iVar4 >> 2);
        entry_00 = paVar21;
      } while (sVar12 != 0);
      sVar10 = (long)pbVar29 - (long)pbVar9;
    }
    archive_entry_xattr_add_entry(entry,(char *)name,pbVar9,sVar10);
    free(name);
    name = pbVar9;
  }
  free(name);
switchD_00157fc0_caseD_1:
  wVar6 = L'\0';
LAB_00158bbf:
  if (local_5c < wVar6) {
    wVar6 = local_5c;
  }
  uVar16 = local_58 - uVar27;
  paVar22 = local_88;
  paVar24 = local_78;
  paVar25 = local_80;
  pcVar26 = local_50;
  uVar32 = local_48;
  uVar35 = uStack_40;
  if (uVar16 == 0) goto LAB_00158d12;
  goto LAB_00157ec0;
LAB_00158a98:
  paVar21 = (archive_entry *)((long)&paVar21->archive + 1);
  lVar8 = lVar8 + 1;
  if (lVar8 == 1) {
    paVar21 = (archive_entry *)((long)&entry_00->archive + sVar12);
LAB_00158ad9:
    sVar12 = 0;
    uVar23 = uVar20;
    goto LAB_00158adc;
  }
  goto LAB_00158a73;
LAB_00158d12:
  if (tar->pax_hdrcharset_binary == 0) goto LAB_00158d2e;
  sc = tar->opt_sconv;
  goto LAB_00158d7d;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, &tar->pax_header);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}